

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

t_float fielddesc_getcoord(_fielddesc *f,t_template *template,t_word *wp,int loud)

{
  t_float val_00;
  t_float val;
  int loud_local;
  t_word *wp_local;
  t_template *template_local;
  _fielddesc *f_local;
  
  if (f->fd_type == '\x01') {
    if (f->fd_var == '\0') {
      f_local._4_4_ = (f->fd_un).fd_float;
    }
    else {
      val_00 = template_getfloat(template,(f->fd_un).fd_symbol,wp,loud);
      f_local._4_4_ = fielddesc_cvttocoord(f,val_00);
    }
  }
  else {
    if (loud != 0) {
      pd_error((void *)0x0,"symbolic data field used as number");
    }
    f_local._4_4_ = 0.0;
  }
  return f_local._4_4_;
}

Assistant:

t_float fielddesc_getcoord(t_fielddesc *f, t_template *template,
    t_word *wp, int loud)
{
    if (f->fd_type == A_FLOAT)
    {
        if (f->fd_var)
        {
            t_float val = template_getfloat(template,
                f->fd_un.fd_varsym, wp, loud);
            return (fielddesc_cvttocoord(f, val));
        }
        else return (f->fd_un.fd_float);
    }
    else
    {
        if (loud)
            pd_error(0, "symbolic data field used as number");
        return (0);
    }
}